

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-wear.c
# Opt level: O3

uint16_t borg_best_stuff_order(int n)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  undefined2 uVar9;
  undefined2 uVar10;
  undefined2 uVar11;
  
  switch(n) {
  case 0:
    uVar1 = z_info->pack_size;
    return uVar1 + 1;
  case 1:
    return z_info->pack_size;
  case 2:
    uVar5 = z_info->pack_size;
    return uVar5 + 6;
  case 3:
    uVar6 = z_info->pack_size;
    return uVar6 + 7;
  case 4:
    uVar3 = z_info->pack_size;
    return uVar3 + 8;
  case 5:
    uVar8 = z_info->pack_size;
    return uVar8 + 9;
  case 6:
    uVar9 = z_info->pack_size;
    return uVar9 + 10;
  case 7:
    uVar7 = z_info->pack_size;
    return uVar7 + 0xb;
  case 8:
    uVar11 = z_info->pack_size;
    return uVar11 + 3;
  case 9:
    uVar4 = z_info->pack_size;
    return uVar4 + 2;
  case 10:
    uVar10 = z_info->pack_size;
    return uVar10 + 5;
  case 0xb:
    uVar2 = z_info->pack_size;
    return uVar2 + 4;
  default:
    return 0xff;
  }
}

Assistant:

static uint16_t borg_best_stuff_order(int n)
{
    switch (n) {
    case 0:
        return INVEN_BOW;
    case 1:
        return INVEN_WIELD;
    case 2:
        return INVEN_BODY;
    case 3:
        return INVEN_OUTER;
    case 4:
        return INVEN_ARM;
    case 5:
        return INVEN_HEAD;
    case 6:
        return INVEN_HANDS;
    case 7:
        return INVEN_FEET;
    case 8:
        return INVEN_LEFT;
    case 9:
        return INVEN_RIGHT;
    case 10:
        return INVEN_LIGHT;
    case 11:
        return INVEN_NECK;
    default:
        return 255;
    }
}